

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFrom(double value,int precision)

{
  int iVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  uint in_ESI;
  SimpleString *in_RDI;
  char *in_XMM0_Qa;
  SimpleString SVar3;
  SimpleString *this;
  size_t sVar2;
  
  this = in_RDI;
  iVar1 = (*PlatformSpecificIsNan)((double)in_XMM0_Qa);
  if (iVar1 == 0) {
    iVar1 = (*PlatformSpecificIsInf)((double)in_XMM0_Qa);
    if (iVar1 == 0) {
      SVar3 = StringFromFormat(in_XMM0_Qa,in_RDI,"%.*g",(ulong)in_ESI);
      sVar2 = SVar3.bufferSize_;
    }
    else {
      SimpleString::SimpleString(this,(char *)in_RDI);
      sVar2 = extraout_RDX_00;
    }
  }
  else {
    SimpleString::SimpleString(this,(char *)in_RDI);
    sVar2 = extraout_RDX;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString StringFrom(double value, int precision)
{
    if (PlatformSpecificIsNan(value))
        return "Nan - Not a number";
    else if (PlatformSpecificIsInf(value))
        return "Inf - Infinity";
    else
        return StringFromFormat("%.*g", precision, value);
}